

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

void re_delete(re_context *ctx)

{
  long in_RDI;
  
  re_reset(ctx);
  if (*(long *)(in_RDI + 0x10) != 0) {
    free(*(void **)(in_RDI + 0x10));
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  if (*(long *)(in_RDI + 0xc0) != 0) {
    free(*(void **)(in_RDI + 0xc0));
    *(undefined8 *)(in_RDI + 0xc0) = 0;
  }
  return;
}

Assistant:

void re_delete(re_context *ctx)
{
    /* reset state */
    re_reset(ctx);
    
    /* if we've allocated an array, delete it */
    if (ctx->tuple_arr != 0)
    {
        mchfre(ctx->tuple_arr);
        ctx->tuple_arr = 0;
    }

    /* if we allocated a string buffer, delete it */
    if (ctx->strbuf != 0)
    {
        mchfre(ctx->strbuf);
        ctx->strbuf = 0;
    }
}